

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContinuumMaterial.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChContinuumElastic::ChContinuumElastic
          (ChContinuumElastic *this,ChContinuumElastic *other)

{
  double dVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  ActualDstType actualDst;
  undefined1 auVar4 [32];
  assign_op<double,_double> local_11;
  
  (this->super_ChContinuumMaterial)._vptr_ChContinuumMaterial =
       (_func_int **)&PTR__ChContinuumElastic_00b26d38;
  auVar2 = *(undefined1 (*) [32])&(other->super_ChContinuumMaterial).density;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_data = (double *)0x0;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_rows = 0;
  (this->StressStrainMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
  m_storage.m_cols = 0;
  auVar3._0_8_ = other->E;
  auVar3._8_8_ = other->v;
  auVar3._16_8_ = other->G;
  auVar3._24_8_ = other->l;
  auVar3 = vpermpd_avx2(auVar3,0xd0);
  auVar2 = vblendps_avx(auVar3,auVar2,3);
  dVar1 = other->G;
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  auVar4._16_8_ = dVar1;
  auVar4._24_8_ = dVar1;
  auVar2 = vblendps_avx(auVar2,auVar4,0xc0);
  *(undefined1 (*) [32])&(this->super_ChContinuumMaterial).density = auVar2;
  this->l = other->l;
  dVar1 = other->damping_K;
  this->damping_M = other->damping_M;
  this->damping_K = dVar1;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
            (&this->StressStrainMatrix,&other->StressStrainMatrix,&local_11);
  return;
}

Assistant:

ChContinuumElastic::ChContinuumElastic(const ChContinuumElastic& other) : ChContinuumMaterial(other) {
    E = other.E;
    v = other.v;
    G = other.G;
    l = other.l;
    damping_M = other.damping_M;
    damping_K = other.damping_K;

    StressStrainMatrix = other.StressStrainMatrix;
}